

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_1U>::getUNORM
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_short,_1U> *this,uint32_t numChannels,uint32_t targetBits,uint32_t sBits)

{
  long lVar1;
  uint uVar2;
  pointer puVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  allocator_type local_3d;
  uint local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  if (1 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x325,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 1>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 1]"
                 );
  }
  if ((targetBits < 0x21) && ((0x100010100U >> ((ulong)targetBits & 0x3f) & 1) != 0)) {
    bVar4 = (byte)targetBits;
    local_3c = ~(-1 << ((byte)sBits & 0x1f)) << (bVar4 - (byte)sBits & 0x1f);
    uVar14 = 0;
    local_38 = __return_storage_ptr__;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((targetBits >> 3) * numChannels * (this->super_Image).height *
                      (this->super_Image).width),&local_3d);
    auVar6 = _DAT_00181500;
    auVar5 = _DAT_001814f0;
    if ((this->super_Image).height != 0) {
      uVar2 = -(uint)(sBits == 0) | local_3c;
      uVar12 = -1 << (bVar4 & 0x1f);
      uVar13 = (ulong)targetBits - 1;
      auVar21._8_4_ = (int)uVar13;
      auVar21._0_8_ = uVar13;
      auVar21._12_4_ = (int)(uVar13 >> 0x20);
      auVar15._0_8_ = uVar13 >> 4;
      auVar15._8_8_ = auVar21._8_8_ >> 4;
      auVar15 = auVar15 ^ _DAT_00181500;
      do {
        if ((this->super_Image).width != 0) {
          uVar7 = 0;
          do {
            if (numChannels == 1) {
              if (0x1f < targetBits - 1) {
                __assert_fail("targetBits > 0 && targetBits <= 32",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0xef,"uint32_t imageio::convertUNORM(uint32_t, uint32_t, uint32_t)");
              }
              uVar8 = (this->super_Image).width * uVar14 + uVar7;
              uVar9 = (uint)this->pixels[uVar8].field_0.comps[0];
              uVar11 = uVar9;
              if (targetBits != 0x10) {
                if (targetBits < 0x10) {
                  uVar11 = (uint)(this->pixels[uVar8].field_0.comps[0] >> (0x10 - bVar4 & 0x1f));
                  if ((1 << (0xf - bVar4 & 0x1f) & uVar9) != 0) {
                    uVar9 = -uVar11 - 2;
                    if (-uVar11 - 2 < uVar12) {
                      uVar9 = uVar12;
                    }
                    uVar11 = ~uVar9;
                  }
                }
                else {
                  lVar10 = 2;
                  auVar16 = ZEXT816(0);
                  iVar19 = 0;
                  do {
                    auVar21 = auVar16;
                    auVar16._0_8_ = ((ulong)uVar9 << (ulong)(targetBits - iVar19)) >> 0x10;
                    auVar16._8_8_ = 0;
                    auVar16 = auVar16 | auVar21;
                    iVar19 = iVar19 + 0x20;
                    lVar1 = ((uVar13 >> 4) + 2 & 0xfffffffffffffffe) + lVar10;
                    lVar10 = lVar10 + -2;
                  } while (lVar1 != 4);
                  lVar10 = -lVar10;
                  auVar17._8_4_ = (int)lVar10;
                  auVar17._0_8_ = lVar10;
                  auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  auVar17 = (auVar17 | auVar5) ^ auVar6;
                  iVar19 = -(uint)(auVar15._0_4_ < auVar17._0_4_);
                  auVar20._4_4_ = -(uint)(auVar15._4_4_ < auVar17._4_4_);
                  iVar22 = -(uint)(auVar15._8_4_ < auVar17._8_4_);
                  auVar20._12_4_ = -(uint)(auVar15._12_4_ < auVar17._12_4_);
                  auVar23._4_4_ = iVar19;
                  auVar23._0_4_ = iVar19;
                  auVar23._8_4_ = iVar22;
                  auVar23._12_4_ = iVar22;
                  auVar18._4_4_ = -(uint)(auVar17._4_4_ == auVar15._4_4_);
                  auVar18._12_4_ = -(uint)(auVar17._12_4_ == auVar15._12_4_);
                  auVar18._0_4_ = auVar18._4_4_;
                  auVar18._8_4_ = auVar18._12_4_;
                  auVar20._0_4_ = auVar20._4_4_;
                  auVar20._8_4_ = auVar20._12_4_;
                  auVar20 = auVar20 | auVar18 & auVar23;
                  auVar21 = ~auVar20 & auVar16 | auVar21 & auVar20;
                  uVar11 = auVar21._8_4_ | auVar21._0_4_;
                }
              }
              puVar3 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = uVar8 * (targetBits >> 3);
              if (targetBits == 0x20) {
                *(uint *)(puVar3 + uVar8) = uVar11 & uVar2;
              }
              else if (targetBits == 0x10) {
                *(ushort *)(puVar3 + uVar8) = (ushort)uVar11 & (ushort)uVar2;
              }
              else if (targetBits == 8) {
                puVar3[uVar8] = (byte)uVar11 & (byte)uVar2;
              }
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < (this->super_Image).width);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (this->super_Image).height);
    }
    return local_38;
  }
  __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x326,
                "virtual std::vector<uint8_t> ImageT<unsigned short, 1>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 1]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUNORM(uint32_t numChannels, uint32_t targetBits, uint32_t sBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32);

        const uint32_t sourceBits = sizeof(componentType) * 8;
        const uint32_t targetBytes = targetBits / 8;
        const uint32_t mask = (sBits == 0) ? 0xFFFFFFFF : ((1u << sBits) - 1u) << (targetBits - sBits);
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto sourceValue = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : Color::one());
                    const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, targetBits);
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    }
                }
            }
        }

        return data;
    }